

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void __thiscall
Test_TemplateModifiers_PrefixLine::Test_TemplateModifiers_PrefixLine
          (Test_TemplateModifiers_PrefixLine *this)

{
  value_type local_18;
  Test_TemplateModifiers_PrefixLine *local_10;
  Test_TemplateModifiers_PrefixLine *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateModifiers, PrefixLine) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestPrefixLine", NULL);
  // These don't escape: we don't put the prefix before the first line
  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1", "   ").c_str(),
               "pt 1");
  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1", "::").c_str(),
               "pt 1");

  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1\npt 2", ":").c_str(),
               "pt 1\n:pt 2");
  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1\npt 2", " ").c_str(),
               "pt 1\n pt 2");
  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1\npt 2", "\n").c_str(),
               "pt 1\n\npt 2");
  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1\npt 2\n", "  ").c_str(),
               "pt 1\n  pt 2\n  ");

  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1\rpt 2\n", ":").c_str(),
               "pt 1\r:pt 2\n:");
  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1\npt 2\r", ":").c_str(),
               "pt 1\n:pt 2\r:");
  EXPECT_STREQ(GOOGLE_NAMESPACE::prefix_line("pt 1\r\npt 2\r", ":").c_str(),
               "pt 1\r\n:pt 2\r:");
}